

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row,HighsInt debug_report)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> value;
  allocator_type local_41;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_40;
  value_type local_28;
  
  local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (result,(long)this->num_col_,(value_type_conflict1 *)&local_40);
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        iVar2 = piVar4[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[lVar9 + 1];
        dVar11 = 0.0;
        if (iVar2 < iVar3) {
          dVar12 = 0.0;
          do {
            dVar14 = pdVar6[piVar5[lVar10]] * pdVar7[lVar10];
            dVar13 = dVar12 + dVar14;
            dVar11 = dVar11 + (dVar12 - (dVar13 - dVar14)) + (dVar14 - (dVar13 - (dVar13 - dVar14)))
            ;
            lVar10 = lVar10 + 1;
            dVar12 = dVar13;
          } while (iVar3 != lVar10);
          dVar11 = dVar11 + dVar13;
        }
        pdVar8[lVar9] = dVar11;
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  else {
    local_28.hi = 0.0;
    local_28.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              (&local_40,(long)this->num_col_,&local_28,&local_41);
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        iVar2 = piVar4[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[lVar9 + 1];
        if (iVar2 < iVar3) {
          do {
            dVar12 = pdVar6[lVar9] * pdVar7[lVar10];
            iVar2 = piVar5[lVar10];
            dVar11 = local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar2].hi;
            dVar13 = dVar12 + dVar11;
            local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2].hi = dVar13;
            local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2].lo =
                 (dVar11 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) +
                 local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar2].lo;
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      pdVar6 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        *(double *)((long)pdVar6 + lVar9) =
             *(double *)
              ((long)&(local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start)->hi + lVar9 * 2) +
             *(double *)
              ((long)&(local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_start)->lo + lVar9 * 2);
        lVar9 = lVar9 + 8;
      } while ((long)iVar1 * 8 != lVar9);
    }
    if (local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result, const vector<double>& row,
    const HighsInt debug_report) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_row_);
  result.assign(this->num_col_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += row[this->index_[iEl]] * this->value_[iEl];
      result[iCol] = double(value);
    }
  } else {
    std::vector<HighsCDouble> value(this->num_col_, 0);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        value[this->index_[iEl]] += row[iRow] * this->value_[iEl];
    }
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
      result[iCol] = double(value[iCol]);
  }
}